

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O1

void __thiscall optimization::graph_color::Conflict_Map::add_node(Conflict_Map *this,VarId *var)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  _Base_ptr p_Var3;
  color cVar4;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  *this_00;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  _Rb_tree_header *p_Var10;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_88;
  VarId local_50;
  VarId local_40;
  
  p_Var10 = &local_88._M_impl.super__Rb_tree_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl._0_8_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var10->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var10->_M_header;
  this_00 = &std::
             map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
             ::operator[](&this->dynamic_Map,var)->_M_t;
  std::
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  ::clear(this_00);
  if (local_88._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    (this_00->_M_impl).super__Rb_tree_header._M_header._M_color =
         local_88._M_impl.super__Rb_tree_header._M_header._M_color;
    (this_00->_M_impl).super__Rb_tree_header._M_header._M_parent =
         local_88._M_impl.super__Rb_tree_header._M_header._M_parent;
    (this_00->_M_impl).super__Rb_tree_header._M_header._M_left =
         local_88._M_impl.super__Rb_tree_header._M_header._M_left;
    (this_00->_M_impl).super__Rb_tree_header._M_header._M_right =
         local_88._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_88._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(this_00->_M_impl).super__Rb_tree_header._M_header;
    (this_00->_M_impl).super__Rb_tree_header._M_node_count =
         local_88._M_impl.super__Rb_tree_header._M_node_count;
    local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var10->_M_header;
    local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var10->_M_header;
  }
  std::
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  ::~_Rb_tree(&local_88);
  pmVar5 = std::
           map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
           ::operator[](&this->static_Map,var);
  p_Var6 = (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var10 = &(pmVar5->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var10) {
    p_Var1 = &(this->dynamic_Map)._M_t._M_impl.super__Rb_tree_header;
    do {
      uVar2 = *(uint *)&p_Var6[1]._M_parent;
      p_Var3 = (this->dynamic_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var8 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
          p_Var3 = (&p_Var3->_M_left)[*(uint *)((long)(p_Var3 + 1) + 8) < uVar2]) {
        if (*(uint *)((long)(p_Var3 + 1) + 8) >= uVar2) {
          p_Var8 = p_Var3;
        }
      }
      p_Var9 = p_Var1;
      if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
         (p_Var9 = (_Rb_tree_header *)p_Var8, uVar2 < *(uint *)((long)p_Var8 + 0x28))) {
        p_Var9 = p_Var1;
      }
      if (p_Var9 != p_Var1) {
        local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
        local_40.id = var->id;
        local_50.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
        local_50.id = uVar2;
        add_edge(this,&local_40,&local_50);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var10);
  }
  pmVar5 = std::
           map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
           ::operator[](&this->dynamic_Map,var);
  cVar4 = available_color(this,pmVar5);
  pmVar7 = std::
           map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
           ::operator[]((this->color_map).
                        super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,var);
  *pmVar7 = cVar4;
  return;
}

Assistant:

void add_node(mir::inst::VarId var) {
    dynamic_Map[var] = std::set<mir::inst::VarId>();
    for (auto neighbor : static_Map[var]) {
      if (dynamic_Map.count(neighbor)) {
        add_edge(var, neighbor);
      }
    }
    (*color_map)[var] = available_color(dynamic_Map[var]);
  }